

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug_p.h
# Opt level: O0

void QtDebugUtils::formatQEnum<QSwipeGesture::SwipeDirection>(QDebug *debug,SwipeDirection value)

{
  QMetaObject *pQVar1;
  long lVar2;
  SwipeDirection in_ESI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  char *key;
  QMetaObject *metaObject;
  QMetaEnum me;
  int t;
  QMetaObject *this;
  undefined4 in_stack_ffffffffffffffd8;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = ::qt_getEnumMetaObject(in_ESI);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  this = pQVar1;
  ::qt_getEnumName(in_ESI);
  QMetaObject::indexOfEnumerator((char *)pQVar1);
  t = (int)((ulong)pQVar1 >> 0x20);
  local_18 = QMetaObject::enumerator((int)this);
  lVar2 = QMetaEnum::valueToKey((ulonglong)local_18);
  if (lVar2 == 0) {
    QDebug::operator<<((QDebug *)this,t);
  }
  else {
    QDebug::operator<<((QDebug *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),in_stack_00000008);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void formatQEnum(QDebug &debug, QEnum value)
{
    const QMetaObject *metaObject = qt_getEnumMetaObject(value);
    const QMetaEnum me = metaObject->enumerator(metaObject->indexOfEnumerator(qt_getEnumName(value)));
    if (const char *key = me.valueToKey(int(value)))
        debug << key;
    else
        debug << int(value);
}